

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937_64.cc
# Opt level: O1

void __thiscall trng::mt19937_64::seed(mt19937_64 *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long local_9e0;
  undefined4 local_9d8;
  undefined8 local_9d0;
  long alStack_9c8 [311];
  
  local_9d8 = 0;
  memset(&local_9d0,0,0x9c0);
  local_9d0 = 0x1571;
  lVar1 = 1;
  uVar4 = 0x1571;
  lVar2 = 3;
  do {
    lVar3 = (uVar4 >> 0x3e ^ uVar4) * 0x5851f42d4c957f2d;
    uVar4 = lVar3 + lVar1;
    (&local_9e0)[lVar2] = lVar2 + lVar3 + -2;
    lVar1 = lVar1 + 1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x13a);
  local_9d8 = 0x138;
  memcpy(this,&local_9e0,0x9d0);
  return;
}

Assistant:

void mt19937_64::seed(unsigned long s) {
    S.mt[0] = s;
    for (S.mti = 1; S.mti < mt19937_64::status_type::N; ++S.mti)
      S.mt[S.mti] =
          (6364136223846793005u * (S.mt[S.mti - 1] ^ (S.mt[S.mti - 1] >> 62u)) + S.mti);
  }